

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

Expectation __thiscall
testing::internal::UntypedFunctionMockerBase::GetHandleOf
          (UntypedFunctionMockerBase *this,ExpectationBase *exp)

{
  ExpectationBase *in_RDX;
  linked_ptr_internal *extraout_RDX;
  linked_ptr_internal *extraout_RDX_00;
  linked_ptr_internal lVar1;
  linked_ptr<testing::internal::ExpectationBase> *an_expectation_base;
  Expectation EVar2;
  allocator<char> local_31;
  string local_30;
  
  an_expectation_base =
       *(linked_ptr<testing::internal::ExpectationBase> **)((long)&(exp->source_text_).field_2 + 8);
  do {
    if (an_expectation_base ==
        *(linked_ptr<testing::internal::ExpectationBase> **)&exp->cardinality_specified_) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,"Cannot find expectation.",&local_31);
      Assert(false,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/thirdparty/gmock/gmock-gtest-all.cc"
             ,0x2aa1,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      Expectation::Expectation((Expectation *)this);
      lVar1.next_ = extraout_RDX;
LAB_00145db2:
      EVar2.expectation_base_.link_.next_ = lVar1.next_;
      EVar2.expectation_base_.value_ = (ExpectationBase *)this;
      return (Expectation)EVar2.expectation_base_;
    }
    if (an_expectation_base->value_ == in_RDX) {
      Expectation::Expectation((Expectation *)this,an_expectation_base);
      lVar1.next_ = extraout_RDX_00;
      goto LAB_00145db2;
    }
    an_expectation_base = an_expectation_base + 1;
  } while( true );
}

Assistant:

Expectation UntypedFunctionMockerBase::GetHandleOf(ExpectationBase* exp) {
  for (UntypedExpectations::const_iterator it =
           untyped_expectations_.begin();
       it != untyped_expectations_.end(); ++it) {
    if (it->get() == exp) {
      return Expectation(*it);
    }
  }

  Assert(false, __FILE__, __LINE__, "Cannot find expectation.");
  return Expectation();
  // The above statement is just to make the code compile, and will
  // never be executed.
}